

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_per_branch(CPUS390XState_conflict *env,uint64_t from,uint64_t to)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = (uint)env->cregs[9];
  if (-1 < (int)uVar4) {
    return;
  }
  if ((uVar4 >> 0x17 & 1) != 0) {
    uVar1 = env->cregs[10];
    uVar2 = env->cregs[0xb];
    if (uVar2 < uVar1) {
      if (to < uVar1 && uVar2 < to) {
        return;
      }
    }
    else if (to < uVar1 || uVar2 < to) {
      return;
    }
  }
  env->per_address = from;
  bVar3 = get_per_atmid(env);
  env->per_perc_atmid = bVar3 | 0x8000;
  return;
}

Assistant:

void HELPER(per_branch)(CPUS390XState *env, uint64_t from, uint64_t to)
{
    if ((env->cregs[9] & PER_CR9_EVENT_BRANCH)) {
        if (!(env->cregs[9] & PER_CR9_CONTROL_BRANCH_ADDRESS)
            || get_per_in_range(env, to)) {
            env->per_address = from;
            env->per_perc_atmid = PER_CODE_EVENT_BRANCH | get_per_atmid(env);
        }
    }
}